

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O0

int * Saig_ManBmcMapping(Gia_ManBmc_t *p,Aig_Obj_t *pObj)

{
  Vec_Int_t *pVVar1;
  Vec_Int_t *p_00;
  int iVar2;
  Aig_Obj_t *pObj_local;
  Gia_ManBmc_t *p_local;
  
  pVVar1 = p->vMapping;
  iVar2 = Aig_ObjId(pObj);
  iVar2 = Vec_IntEntry(pVVar1,iVar2);
  if (iVar2 == 0) {
    p_local = (Gia_ManBmc_t *)0x0;
  }
  else {
    pVVar1 = p->vMapping;
    p_00 = p->vMapping;
    iVar2 = Aig_ObjId(pObj);
    iVar2 = Vec_IntEntry(p_00,iVar2);
    p_local = (Gia_ManBmc_t *)Vec_IntEntryP(pVVar1,iVar2);
  }
  return (int *)p_local;
}

Assistant:

static inline int * Saig_ManBmcMapping( Gia_ManBmc_t * p, Aig_Obj_t * pObj )
{
    if ( Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) == 0 )
        return NULL;
    return Vec_IntEntryP( p->vMapping, Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) );
}